

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::UpdateComputedMode(EventLog *this)

{
  uint32 uVar1;
  TTDMode b;
  int iVar2;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ScriptContext **ppSVar3;
  int local_2c;
  int32 i_1;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *contexts;
  uint local_18;
  TTDMode m;
  uint32 i;
  TTDMode cm;
  EventLog *this_local;
  
  _i = this;
  uVar1 = TTModeStack::Count(&this->m_modeStack);
  if (uVar1 == 0) {
    TTDAbort_unrecoverable_error("Should never be empty!!!");
  }
  m = Invalid;
  local_18 = 0;
  do {
    uVar1 = TTModeStack::Count(&this->m_modeStack);
    if (uVar1 <= local_18) {
      this->m_currentMode = m;
      this_00 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
      for (local_2c = 0;
          iVar2 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                  ::Count(&this_00->
                           super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                         ), local_2c < iVar2; local_2c = local_2c + 1) {
        ppSVar3 = JsUtil::
                  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,local_2c);
        SetModeFlagsOnContext(this,*ppSVar3);
      }
      return;
    }
    b = TTModeStack::GetAt(&this->m_modeStack,local_18);
    if (b == CurrentlyEnabled) {
LAB_00c9a3c5:
      if (local_18 == 0) {
        TTDAbort_unrecoverable_error("A base mode should always be first on the stack.");
      }
      operator|=(&m,b);
      b = m;
    }
    else {
      if ((b != RecordMode) && (b != ReplayMode)) {
        if (((b != DebuggerAttachedMode) &&
            (((b != ExcludedExecutionTTAction && (b != ExcludedExecutionDebuggerAction)) &&
             (b != DebuggerSuppressGetter)))) &&
           ((b != DebuggerSuppressBreakpoints && (b != DebuggerLogBreakpoints)))) {
          TTDAbort_unrecoverable_error("This mode is unknown or should never appear.");
        }
        goto LAB_00c9a3c5;
      }
      if (local_18 != 0) {
        TTDAbort_unrecoverable_error("One of these should always be first on the stack.");
      }
    }
    m = b;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void EventLog::UpdateComputedMode()
    {
        TTDAssert(this->m_modeStack.Count() > 0, "Should never be empty!!!");

        TTDMode cm = TTDMode::Invalid;
        for(uint32 i = 0; i < this->m_modeStack.Count(); ++i)
        {
            TTDMode m = this->m_modeStack.GetAt(i);
            switch(m)
            {
            case TTDMode::RecordMode:
            case TTDMode::ReplayMode:
                TTDAssert(i == 0, "One of these should always be first on the stack.");
                cm = m;
                break;
            case TTDMode::DebuggerAttachedMode:
            case TTDMode::CurrentlyEnabled:
            case TTDMode::ExcludedExecutionTTAction:
            case TTDMode::ExcludedExecutionDebuggerAction:
            case TTDMode::DebuggerSuppressGetter:
            case TTDMode::DebuggerSuppressBreakpoints:
            case TTDMode::DebuggerLogBreakpoints:
                TTDAssert(i != 0, "A base mode should always be first on the stack.");
                cm |= m;
                break;
            default:
                TTDAssert(false, "This mode is unknown or should never appear.");
                break;
            }
        }

        this->m_currentMode = cm;

        //Set fast path values on ThreadContext
        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& contexts = this->m_threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < contexts.Count(); ++i)
        {
            this->SetModeFlagsOnContext(contexts.Item(i));
        }
    }